

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O0

Gia_Man_t * Gia_ManDupOneHot(Gia_Man_t *p)

{
  int iVar1;
  int nVars;
  Gia_Man_t *p_00;
  Gia_Man_t *pNew;
  Gia_Man_t *pOneHot;
  Gia_Man_t *p_local;
  
  p_00 = Gia_ManDup(p);
  iVar1 = Gia_ManRegNum(p_00);
  if (iVar1 == 0) {
    Abc_Print(0,"Appending 1-hotness constraints to the PIs.\n");
    iVar1 = Gia_ManCiNum(p_00);
    pNew = Gia_ManOneHot(0,iVar1);
  }
  else {
    iVar1 = Gia_ManPiNum(p_00);
    nVars = Gia_ManRegNum(p_00);
    pNew = Gia_ManOneHot(iVar1,nVars);
  }
  Gia_ManDupAppendShare(p_00,pNew);
  iVar1 = Gia_ManPoNum(pNew);
  p_00->nConstrs = iVar1 + p_00->nConstrs;
  Gia_ManStop(pNew);
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupOneHot( Gia_Man_t * p )
{
    Gia_Man_t * pOneHot, * pNew = Gia_ManDup( p );
    if ( Gia_ManRegNum(pNew) == 0 )
    {
        Abc_Print( 0, "Appending 1-hotness constraints to the PIs.\n" );
        pOneHot = Gia_ManOneHot( 0, Gia_ManCiNum(pNew) );
    }
    else
        pOneHot = Gia_ManOneHot( Gia_ManPiNum(pNew), Gia_ManRegNum(pNew) );
    Gia_ManDupAppendShare( pNew, pOneHot );
    pNew->nConstrs += Gia_ManPoNum(pOneHot);
    Gia_ManStop( pOneHot );
    return pNew;
}